

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall
Preprocessor::preprocess(Preprocessor *this,QByteArray *filename,Symbols *preprocessed)

{
  stack<QByteArray,_QList<QByteArray>_> *this_00;
  qsizetype *index;
  Macros *this_01;
  char *pcVar1;
  byte bVar2;
  Token TVar3;
  int iVar4;
  Int IVar5;
  Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *this_02;
  qsizetype qVar6;
  Data *pDVar7;
  undefined8 uVar8;
  Data *pDVar9;
  qsizetype qVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  Node<QByteArray,_QHashDummyValue> *pNVar14;
  Token *pTVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  Symbol *pSVar19;
  qsizetype i;
  ulong uVar20;
  long lVar21;
  storage_type *psVar22;
  long in_FS_OFFSET;
  bool bVar23;
  QByteArrayView QVar24;
  Bucket BVar25;
  Symbol sym;
  SubArray local_108;
  Macro local_d8;
  QArrayDataPointer<Symbol> local_98;
  QArrayDataPointer<Symbol> local_80;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_Parser).currentFilenames;
  QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
            ((QMovableArrayOps<QByteArray> *)this_00,(this->super_Parser).currentFilenames.c.d.size,
             filename);
  QList<QByteArray>::end(&this_00->c);
  QList<Symbol>::reserve(preprocessed,(this->super_Parser).symbols.d.size + (preprocessed->d).size);
  lVar17 = (this->super_Parser).symbols.d.size;
  lVar18 = (this->super_Parser).index;
  if (lVar17 <= lVar18) {
LAB_00133e44:
    std::stack<QByteArray,_QList<QByteArray>_>::pop(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  index = &(this->super_Parser).index;
  this_01 = &this->macros;
LAB_001330c3:
  lVar21 = lVar18 + 1;
  (this->super_Parser).index = lVar21;
  pSVar19 = (this->super_Parser).symbols.d.ptr;
  TVar3 = pSVar19[lVar18].token;
  switch(TVar3) {
  case NEWLINE:
    break;
  case PP_WHITESPACE:
  case BACKSLASH:
  case INCOMPLETE:
  case PP_HASHHASH:
switchD_001330f8_caseD_a5:
    QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
              ((QMovableArrayOps<Symbol> *)preprocessed,(preprocessed->d).size,pSVar19 + lVar18);
    QList<Symbol>::end(preprocessed);
    break;
  case PP_DEFINE:
    if (lVar21 < lVar17) {
      lVar21 = lVar18 + 2;
      *index = lVar21;
    }
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::mid((longlong)&local_58,(longlong)&pSVar19[lVar21 + -1].lex);
    if ((Symbol *)local_58.d.size == (Symbol *)0x0) {
LAB_00133e73:
      Parser::error(&this->super_Parser,(char *)0x0);
    }
    if (((Symbol *)local_58.d.d == (Symbol *)0x0) ||
       (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_58,(AllocationOption)local_58.d.size);
    }
    bVar2 = (byte)(((QBasicAtomicInt *)local_58.d.ptr)->_q_value).super___atomic_base<int>._M_i;
    if (((0x19 < (int)(char)(bVar2 & 0xdf) - 0x41U) && (bVar2 != 0x24)) && (bVar2 != 0x5f))
    goto LAB_00133e73;
    local_d8.symbols.d.ptr = (Symbol *)0x0;
    local_d8.symbols.d.size = 0;
    local_d8.arguments.d.size = 0;
    local_d8.symbols.d.d = (Data *)0x0;
    local_d8.arguments.d.d = (Data *)0x0;
    local_d8.arguments.d.ptr = (Symbol *)0x0;
    lVar18 = (this->super_Parser).symbols.d.size;
    uVar20 = (this->super_Parser).index;
    if (((long)uVar20 < lVar18) && ((this->super_Parser).symbols.d.ptr[uVar20].token == LPAREN)) {
      (this->super_Parser).index = uVar20 + 1;
      local_d8._0_8_ = (Data *)0xaaaaaaaaaaaa0001;
      parseDefineArguments(this,&local_d8);
      lVar18 = (this->super_Parser).symbols.d.size;
      uVar20 = (this->super_Parser).index;
    }
    else {
      local_d8._0_8_ = (Data *)0xaaaaaaaaaaaa0000;
    }
    lVar17 = uVar20 * 0x30;
    pTVar15 = &(this->super_Parser).symbols.d.ptr[uVar20].token;
    uVar16 = uVar20;
    do {
      if (lVar18 <= (long)uVar16) break;
      uVar16 = uVar16 + 1;
      *index = uVar16;
      TVar3 = *pTVar15;
      pTVar15 = pTVar15 + 0xc;
    } while (TVar3 != NEWLINE);
    QList<Symbol>::reserve(&local_d8.symbols,~uVar20 + uVar16);
    lVar18 = *index;
    if ((long)uVar20 < lVar18 + -1) {
      iVar12 = 0x9e;
      do {
        pSVar19 = (this->super_Parser).symbols.d.ptr;
        iVar4 = *(int *)((long)&pSVar19->token + lVar17);
        if (iVar4 == 0xb1) {
          if ((local_d8.symbols.d.size != 0) && (iVar12 == 0xa5)) {
            QList<Symbol>::pop_back(&local_d8.symbols);
            pSVar19 = (this->super_Parser).symbols.d.ptr;
          }
LAB_001336f8:
          QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                    ((QMovableArrayOps<Symbol> *)&local_d8.symbols,local_d8.symbols.d.size,
                     (Symbol *)((long)&pSVar19->lineNum + lVar17));
          QList<Symbol>::end(&local_d8.symbols);
          lVar18 = *index;
          iVar12 = iVar4;
        }
        else if (((iVar4 != 0xa5) || (0x14 < iVar12 - 0x9eU)) ||
                ((0x180081U >> (iVar12 - 0x9eU & 0x1f) & 1) == 0)) goto LAB_001336f8;
        uVar20 = uVar20 + 1;
        lVar17 = lVar17 + 0x30;
      } while ((long)uVar20 < lVar18 + -1);
    }
    while (local_d8.symbols.d.size != 0) {
      IVar5 = (((ArrayOptions *)&local_d8.symbols.d.ptr[local_d8.symbols.d.size + -1].token)->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i;
      if (IVar5 != 0xa5) {
        if (((((ArrayOptions *)&(local_d8.symbols.d.ptr)->token)->
             super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
             super_QFlagsStorage<QArrayData::ArrayOption>.i == 0xb1) || (IVar5 == 0xb1)) {
          Parser::error(&this->super_Parser,
                        "\'##\' cannot appear at either end of a macro expansion");
        }
        break;
      }
      QList<Symbol>::pop_back(&local_d8.symbols);
    }
    if ((Symbol *)local_58.d.d != (Symbol *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&((Symbol *)local_58.d.d)->lineNum)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&((Symbol *)local_58.d.d)->lineNum)->_q_value).
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_108.from = 0;
    local_108.array.d.d = local_58.d.d;
    local_108.array.d.ptr = local_58.d.ptr;
    local_108.array.d.size = local_58.d.size;
    local_108.len = local_58.d.size;
    QHash<SubArray,Macro>::emplace<Macro_const&>
              ((QHash<SubArray,Macro> *)this_01,&local_108,&local_d8);
    if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
      LOCK();
      ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_108.array.d.d)->super_QArrayData,1,0x10);
      }
    }
    QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_d8.symbols.d);
    QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_d8.arguments.d);
    if ((Symbol *)local_58.d.d == (Symbol *)0x0) break;
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pSVar19 = (Symbol *)local_58.d.d;
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0) break;
LAB_00133e24:
    QArrayData::deallocate((QArrayData *)pSVar19,1,0x10);
    break;
  case PP_UNDEF:
    if (lVar21 < lVar17) {
      lVar21 = lVar18 + 2;
      *index = lVar21;
    }
    local_108.array.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_108.array.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_108.array.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::mid((longlong)&local_108,(longlong)&pSVar19[lVar21 + -1].lex);
    lVar18 = (this->super_Parser).symbols.d.size;
    lVar17 = (this->super_Parser).index;
    pTVar15 = &(this->super_Parser).symbols.d.ptr[lVar17].token;
    do {
      if (lVar18 <= lVar17) break;
      lVar17 = lVar17 + 1;
      *index = lVar17;
      TVar3 = *pTVar15;
      pTVar15 = pTVar15 + 0xc;
    } while (TVar3 != NEWLINE);
    local_d8._0_8_ = local_108.array.d.d;
    local_d8.arguments.d.d = (Data *)local_108.array.d.ptr;
    local_d8.arguments.d.ptr = (Symbol *)local_108.array.d.size;
    if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
      LOCK();
      ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    local_d8.arguments.d.size = 0;
    local_d8.symbols.d.d = (Data *)local_108.array.d.size;
    QHash<SubArray,_Macro>::removeImpl<SubArray>(this_01,(SubArray *)&local_d8);
    if ((Data *)local_d8._0_8_ != (Data *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
      }
    }
LAB_00133e10:
    if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
      LOCK();
      ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      pSVar19 = (Symbol *)local_108.array.d.d;
      if (((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) goto LAB_00133e24;
    }
    break;
  case PP_IF:
  case PP_IFDEF:
  case PP_IFNDEF:
    while ((iVar12 = evaluateCondition(this), iVar12 == 0 && (bVar23 = skipBranch(this), bVar23))) {
      lVar18 = (this->super_Parser).index;
      pSVar19 = (this->super_Parser).symbols.d.ptr;
      lVar17 = (this->super_Parser).symbols.d.size;
      if ((lVar17 <= lVar18) || (pSVar19[lVar18].token != PP_ELIF)) {
        pTVar15 = &pSVar19[lVar18].token;
        goto LAB_00133797;
      }
      (this->super_Parser).index = lVar18 + 1;
    }
    break;
  case PP_ELIF:
  case PP_ELSE:
    skipUntilEndif(this);
    pSVar19 = (this->super_Parser).symbols.d.ptr;
    lVar17 = (this->super_Parser).symbols.d.size;
    lVar21 = (this->super_Parser).index;
  case PP_ENDIF:
    pTVar15 = &pSVar19[lVar21].token;
    do {
      if (lVar17 <= lVar21) break;
      lVar21 = lVar21 + 1;
      *index = lVar21;
      TVar3 = *pTVar15;
      pTVar15 = pTVar15 + 0xc;
    } while (TVar3 != NEWLINE);
    break;
  case PP_INCLUDE:
    iVar12 = pSVar19[lVar18].lineNum;
    local_108.array.d.d = (Data *)0x0;
    local_108.array.d.ptr = (char *)0x0;
    local_108.array.d.size = 0;
    if (lVar21 < lVar17) {
      if (pSVar19[lVar21].token == PP_STRING_LITERAL) {
        *index = lVar18 + 2;
        QByteArray::mid((longlong)&local_d8,(longlong)&pSVar19[lVar18 + 1].lex);
        if (local_d8.arguments.d.ptr == (Symbol *)0x0) {
          bVar23 = false;
        }
        else {
          bVar23 = (char)((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i == '\"';
        }
        if ((Data *)local_d8._0_8_ != (Data *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
          }
        }
        QByteArray::mid((longlong)&local_d8,
                        (longlong)
                        &(this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lex);
        pSVar19 = local_d8.arguments.d.ptr;
        uVar8 = local_d8._0_8_;
        pcVar1 = local_108.array.d.ptr;
        pDVar7 = local_108.array.d.d;
        local_d8._0_8_ = local_108.array.d.d;
        local_108.array.d.d = (Data *)uVar8;
        local_108.array.d.ptr = (char *)local_d8.arguments.d.d;
        local_d8.arguments.d.d = (Data *)pcVar1;
        local_d8.arguments.d.ptr = (Symbol *)local_108.array.d.size;
        local_108.array.d.size = (qsizetype)pSVar19;
        if ((Symbol *)pDVar7 != (Symbol *)0x0) {
          LOCK();
          (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar7->super_QArrayData,1,0x10);
          }
        }
        lVar18 = (this->super_Parser).symbols.d.size;
        lVar17 = (this->super_Parser).index;
        pTVar15 = &(this->super_Parser).symbols.d.ptr[lVar17].token;
        do {
          if (lVar18 <= lVar17) break;
          lVar17 = lVar17 + 1;
          *index = lVar17;
          TVar3 = *pTVar15;
          pTVar15 = pTVar15 + 0xc;
        } while (TVar3 != NEWLINE);
        if (bVar23) {
          local_58.d.d = (filename->d).d;
          local_58.d.ptr = (filename->d).ptr;
          local_58.d.size = (filename->d).size;
          if ((Symbol *)local_58.d.d != (Symbol *)0x0) {
            LOCK();
            (((QArrayData *)&((Symbol *)local_58.d.d)->lineNum)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((Symbol *)local_58.d.d)->lineNum)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        else {
          local_58.d.d = (Data *)0x0;
          local_58.d.ptr = (char *)0x0;
          local_58.d.size = 0;
        }
        resolveInclude((QByteArray *)&local_d8,this,&local_108.array,&local_58);
        pSVar19 = local_d8.arguments.d.ptr;
        uVar8 = local_d8._0_8_;
        pcVar1 = local_108.array.d.ptr;
        pDVar7 = local_108.array.d.d;
        local_d8._0_8_ = local_108.array.d.d;
        local_108.array.d.d = (Data *)uVar8;
        local_108.array.d.ptr = (char *)local_d8.arguments.d.d;
        local_d8.arguments.d.d = (Data *)pcVar1;
        local_d8.arguments.d.ptr = (Symbol *)local_108.array.d.size;
        local_108.array.d.size = (qsizetype)pSVar19;
        if ((Data *)pDVar7 != (Data *)0x0) {
          LOCK();
          (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar7->super_QArrayData,1,0x10);
          }
        }
        if ((Symbol *)local_58.d.d != (Symbol *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (((Symbol *)local_108.array.d.ptr != (Symbol *)0x0) &&
           ((this_02 = (this->preprocessedIncludes).q_hash.d,
            this_02 == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0 ||
            (pNVar14 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                       findNode<QByteArray>(this_02,&local_108.array),
            pNVar14 == (Node<QByteArray,_QHashDummyValue> *)0x0)))) {
          QHash<QByteArray,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QByteArray,QHashDummyValue> *)&this->preprocessedIncludes,
                     &local_108.array,(QHashDummyValue *)&local_d8);
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          pSVar19 = (Symbol *)local_108.array.d.ptr;
          if ((Symbol *)local_108.array.d.ptr == (Symbol *)0x0) {
            pSVar19 = (Symbol *)&QByteArray::_empty;
          }
          psVar22 = (storage_type *)0xffffffffffffffff;
          do {
            pcVar1 = (char *)((long)&(((QBasicAtomicInt *)&pSVar19->lineNum)->_q_value).
                                     super___atomic_base<int>._M_i + 1) + (long)psVar22;
            psVar22 = psVar22 + 1;
          } while (*pcVar1 != '\0');
          QVar24.m_data = psVar22;
          QVar24.m_size = (qsizetype)&local_d8;
          QString::fromLocal8Bit(QVar24);
          QFile::QFile((QFile *)&local_68,(QString *)&local_d8);
          if ((Data *)local_d8._0_8_ != (Data *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
            }
          }
          cVar11 = QFile::open((QFile *)&local_68,1);
          if (cVar11 != '\0') {
            local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            readOrMapFile(&local_58,(QFile *)&local_68);
            QFileDevice::close();
            if ((Symbol *)local_58.d.size != (Symbol *)0x0) {
              local_80.d = (this->super_Parser).symbols.d.d;
              local_80.ptr = (this->super_Parser).symbols.d.ptr;
              local_80.size = (this->super_Parser).symbols.d.size;
              if (local_80.d != (Data *)0x0) {
                LOCK();
                ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     1;
                UNLOCK();
              }
              qVar6 = *index;
              cleaned((QByteArray *)&local_d8,&local_58);
              pcVar1 = local_58.d.ptr;
              pDVar7 = local_58.d.d;
              pSVar19 = local_d8.arguments.d.ptr;
              uVar8 = local_d8._0_8_;
              local_d8._0_8_ = local_58.d.d;
              local_58.d.d = (Data *)uVar8;
              local_58.d.ptr = (char *)local_d8.arguments.d.d;
              local_d8.arguments.d.d = (Data *)pcVar1;
              local_d8.arguments.d.ptr = (Symbol *)local_58.d.size;
              local_58.d.size = (qsizetype)pSVar19;
              if ((Symbol *)pDVar7 != (Symbol *)0x0) {
                LOCK();
                (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar7->super_QArrayData,1,0x10);
                }
              }
              tokenize((Symbols *)&local_98,&local_58,1,TokenizeCpp);
              qVar10 = local_98.size;
              pSVar19 = local_98.ptr;
              pDVar9 = local_98.d;
              local_98.size = 0;
              local_98.d = (Data *)0x0;
              local_98.ptr = (Symbol *)0x0;
              local_d8._0_8_ = (this->super_Parser).symbols.d.d;
              local_d8.arguments.d.d = (Data *)(this->super_Parser).symbols.d.ptr;
              (this->super_Parser).symbols.d.d = pDVar9;
              (this->super_Parser).symbols.d.ptr = pSVar19;
              local_d8.arguments.d.ptr = (Symbol *)(this->super_Parser).symbols.d.size;
              (this->super_Parser).symbols.d.size = qVar10;
              QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_d8);
              QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_98);
              QByteArray::clear();
              (this->super_Parser).index = 0;
              local_d8._0_8_ = (Data *)0x9900000000;
              local_d8.arguments.d.d = (Data *)local_108.array.d.d;
              local_d8.arguments.d.ptr = (Symbol *)local_108.array.d.ptr;
              local_d8.arguments.d.size = local_108.array.d.size;
              if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
                LOCK();
                ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_108.array.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              local_d8.symbols.d.d = (Data *)0x0;
              local_d8.symbols.d.ptr = (Symbol *)local_108.array.d.size;
              QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
                        ((QMovableArrayOps<Symbol> *)preprocessed,(preprocessed->d).size,
                         (Symbol *)&local_d8);
              QList<Symbol>::end(preprocessed);
              if ((Symbol *)local_d8.arguments.d.d != (Symbol *)0x0) {
                LOCK();
                ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_d8.arguments.d.d)->super_QArrayData,1,0x10);
                }
              }
              preprocess(this,&local_108.array,preprocessed);
              local_d8._4_4_ = 0x9a;
              local_d8._0_4_ = iVar12;
              local_d8.arguments.d.d = (Data *)local_108.array.d.d;
              local_d8.arguments.d.ptr = (Symbol *)local_108.array.d.ptr;
              local_d8.arguments.d.size = local_108.array.d.size;
              if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
                LOCK();
                ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_108.array.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              local_d8.symbols.d.d = (Data *)0x0;
              local_d8.symbols.d.ptr = (Symbol *)local_108.array.d.size;
              QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
                        ((QMovableArrayOps<Symbol> *)preprocessed,(preprocessed->d).size,
                         (Symbol *)&local_d8);
              QList<Symbol>::end(preprocessed);
              if ((Symbol *)local_d8.arguments.d.d != (Symbol *)0x0) {
                LOCK();
                ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_d8.arguments.d.d)->super_QArrayData,1,0x10);
                }
              }
              QArrayDataPointer<Symbol>::operator=((QArrayDataPointer<Symbol> *)this,&local_80);
              (this->super_Parser).index = qVar6;
              QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_80);
            }
            if ((Symbol *)local_58.d.d != (Symbol *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
              }
            }
          }
          QFile::~QFile((QFile *)&local_68);
        }
      }
      goto LAB_00133e10;
    }
    break;
  case PP_HASH:
    pTVar15 = &pSVar19[lVar18 + 1].token;
    lVar18 = lVar18 + 2;
    do {
      if (lVar17 <= lVar18 + -1) break;
      *index = lVar18;
      lVar18 = lVar18 + 1;
      TVar3 = *pTVar15;
      pTVar15 = pTVar15 + 0xc;
    } while (TVar3 != NEWLINE);
    break;
  default:
    if (TVar3 - SIGNALS < 2) {
      local_d8._0_8_ = *(undefined8 *)(pSVar19 + lVar18);
      local_d8.arguments.d.d = (Data *)pSVar19[lVar18].lex.d.d;
      local_d8.arguments.d.ptr = (Symbol *)pSVar19[lVar18].lex.d.ptr;
      local_d8.arguments.d.size = pSVar19[lVar18].lex.d.size;
      if ((Symbol *)local_d8.arguments.d.d != (Symbol *)0x0) {
        LOCK();
        (((QArrayData *)&((Symbol *)local_d8.arguments.d.d)->lineNum)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((Symbol *)local_d8.arguments.d.d)->lineNum)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_d8.symbols.d.d = (Data *)pSVar19[lVar18].from;
      local_d8.symbols.d.ptr = (Symbol *)pSVar19[lVar18].len;
      QByteArray::QByteArray(&local_108.array,"QT_NO_KEYWORDS",-1);
      local_108.from = 0;
      local_108.len = local_108.array.d.size;
      if (this_01->d == (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0) {
LAB_001332d9:
        bVar23 = false;
      }
      else {
        BVar25 = QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findBucket<SubArray>
                           (this_01->d,&local_108);
        if ((BVar25.span)->offsets[BVar25.index] == 0xff) goto LAB_001332d9;
        bVar23 = (BVar25.span)->entries != (Entry *)0x0;
      }
      if ((Symbol *)local_108.array.d.d != (Symbol *)0x0) {
        LOCK();
        ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_108.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_108.array.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar13 = TVar3 == SIGNALS ^ 0x8b;
      if (bVar23) {
        uVar13 = 1;
      }
      local_d8._4_4_ = uVar13;
      QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                ((QMovableArrayOps<Symbol> *)preprocessed,(preprocessed->d).size,(Symbol *)&local_d8
                );
      QList<Symbol>::end(preprocessed);
      if ((Symbol *)local_d8.arguments.d.d != (Symbol *)0x0) {
        LOCK();
        ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_d8.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_d8.arguments.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
    else {
      if (TVar3 != IDENTIFIER) goto switchD_001330f8_caseD_a5;
      local_d8._0_8_ = (Data *)0x0;
      macroExpand(preprocessed,this,(Symbols *)this,index,pSVar19[lVar18].lineNum,true,
                  (QSet<QByteArray> *)&local_d8);
      QHash<QByteArray,_QHashDummyValue>::~QHash((QHash<QByteArray,_QHashDummyValue> *)&local_d8);
    }
  }
  goto switchD_001330f8_caseD_a4;
  while( true ) {
    lVar18 = lVar18 + 1;
    *index = lVar18;
    TVar3 = *pTVar15;
    pTVar15 = pTVar15 + 0xc;
    if (TVar3 == NEWLINE) break;
LAB_00133797:
    if (lVar17 <= lVar18) break;
  }
switchD_001330f8_caseD_a4:
  lVar17 = (this->super_Parser).symbols.d.size;
  lVar18 = (this->super_Parser).index;
  if (lVar17 <= lVar18) goto LAB_00133e44;
  goto LAB_001330c3;
}

Assistant:

void Preprocessor::preprocess(const QByteArray &filename, Symbols &preprocessed)
{
    currentFilenames.push(filename);
    preprocessed.reserve(preprocessed.size() + symbols.size());
    while (hasNext()) {
        Token token = next();

        switch (token) {
        case PP_INCLUDE:
        {
            int lineNum = symbol().lineNum;
            QByteArray include;
            bool local = false;
            if (test(PP_STRING_LITERAL)) {
                local = lexem().startsWith('\"');
                include = unquotedLexem();
            } else
                continue;
            until(PP_NEWLINE);

            include = resolveInclude(include, local ? filename : QByteArray());
            if (include.isNull())
                continue;

            if (Preprocessor::preprocessedIncludes.contains(include))
                continue;
            Preprocessor::preprocessedIncludes.insert(include);

            QFile file(QString::fromLocal8Bit(include.constData()));
            if (!file.open(QFile::ReadOnly))
                continue;

            QByteArray input = readOrMapFile(&file);

            file.close();
            if (input.isEmpty())
                continue;

            Symbols saveSymbols = symbols;
            qsizetype saveIndex = index;

            // phase 1: get rid of backslash-newlines
            input = cleaned(input);

            // phase 2: tokenize for the preprocessor
            symbols = tokenize(input);
            input.clear();

            index = 0;

            // phase 3: preprocess conditions and substitute macros
            preprocessed += Symbol(0, MOC_INCLUDE_BEGIN, include);
            preprocess(include, preprocessed);
            preprocessed += Symbol(lineNum, MOC_INCLUDE_END, include);

            symbols = saveSymbols;
            index = saveIndex;
            continue;
        }
        case PP_DEFINE:
        {
            next();
            QByteArray name = lexem();
            if (name.isEmpty() || !is_ident_start(name[0]))
                error();
            Macro macro;
            macro.isVariadic = false;
            if (test(LPAREN)) {
                // we have a function macro
                macro.isFunction = true;
                parseDefineArguments(&macro);
            } else {
                macro.isFunction = false;
            }
            qsizetype start = index;
            until(PP_NEWLINE);
            macro.symbols.reserve(index - start - 1);

            // remove whitespace where there shouldn't be any:
            // Before and after the macro, after a # and around ##
            Token lastToken = HASH; // skip shitespace at the beginning
            for (qsizetype i = start; i < index - 1; ++i) {
                Token token = symbols.at(i).token;
                if (token == WHITESPACE) {
                    if (lastToken == PP_HASH || lastToken == HASH ||
                        lastToken == PP_HASHHASH ||
                        lastToken == WHITESPACE)
                        continue;
                } else if (token == PP_HASHHASH) {
                    if (!macro.symbols.isEmpty() &&
                        lastToken == WHITESPACE)
                        macro.symbols.pop_back();
                }
                macro.symbols.append(symbols.at(i));
                lastToken = token;
            }
            // remove trailing whitespace
            while (!macro.symbols.isEmpty() &&
                   (macro.symbols.constLast().token == PP_WHITESPACE || macro.symbols.constLast().token == WHITESPACE))
                macro.symbols.pop_back();

            if (!macro.symbols.isEmpty()) {
                if (macro.symbols.constFirst().token == PP_HASHHASH ||
                    macro.symbols.constLast().token == PP_HASHHASH) {
                    error("'##' cannot appear at either end of a macro expansion");
                }
            }
            macros.insert(name, macro);
            continue;
        }
        case PP_UNDEF: {
            next();
            QByteArray name = lexem();
            until(PP_NEWLINE);
            macros.remove(name);
            continue;
        }
        case PP_IDENTIFIER: {
            // substitute macros
            macroExpand(&preprocessed, this, symbols, index, symbol().lineNum, true);
            continue;
        }
        case PP_HASH:
            until(PP_NEWLINE);
            continue; // skip unknown preprocessor statement
        case PP_IFDEF:
        case PP_IFNDEF:
        case PP_IF:
            while (!evaluateCondition()) {
                if (!skipBranch())
                    break;
                if (test(PP_ELIF)) {
                } else {
                    until(PP_NEWLINE);
                    break;
                }
            }
            continue;
        case PP_ELIF:
        case PP_ELSE:
            skipUntilEndif();
            Q_FALLTHROUGH();
        case PP_ENDIF:
            until(PP_NEWLINE);
            continue;
        case PP_NEWLINE:
            continue;
        case SIGNALS:
        case SLOTS: {
            Symbol sym = symbol();
            if (macros.contains("QT_NO_KEYWORDS"))
                sym.token = IDENTIFIER;
            else
                sym.token = (token == SIGNALS ? Q_SIGNALS_TOKEN : Q_SLOTS_TOKEN);
            preprocessed += sym;
        } continue;
        default:
            break;
        }
        preprocessed += symbol();
    }

    currentFilenames.pop();
}